

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

void history_def_delete(history_t *h,HistEvent *ev,hentry_t_conflict *hp)

{
  HistEventPrivate_conflict *evp;
  hentry_t_conflict *hp_local;
  HistEvent *ev_local;
  history_t *h_local;
  
  if ((history_t *)hp != h) {
    if ((h->cursor == hp) && (h->cursor = hp->prev, (history_t *)h->cursor == h)) {
      h->cursor = hp->next;
    }
    hp->prev->next = hp->next;
    hp->next->prev = hp->prev;
    free((hp->ev).str);
    free(hp);
    h->cur = h->cur + -1;
    return;
  }
  abort();
}

Assistant:

static void
history_def_delete(history_t *h,
		   TYPE(HistEvent) *ev __attribute__((__unused__)), hentry_t *hp)
{
	HistEventPrivate *evp = (void *)&hp->ev;
	if (hp == &h->list)
		abort();
	if (h->cursor == hp) {
		h->cursor = hp->prev;
		if (h->cursor == &h->list)
			h->cursor = hp->next;
	}
	hp->prev->next = hp->next;
	hp->next->prev = hp->prev;
	h_free(evp->str);
	h_free(hp);
	h->cur--;
}